

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void SUNDlsMat_bandScale(sunrealtype c,sunrealtype **a,sunindextype n,sunindextype mu,
                        sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  sunrealtype *col_j;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  sunindextype smu_local;
  sunindextype ml_local;
  sunindextype mu_local;
  sunindextype n_local;
  sunrealtype **a_local;
  sunrealtype c_local;
  
  for (j = 0; j < n; j = j + 1) {
    psVar1 = a[j];
    for (i = 0; i < mu + ml + 1; i = i + 1) {
      psVar1[smu + (i - mu)] = c * psVar1[smu + (i - mu)];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandScale(sunrealtype c, sunrealtype** a, sunindextype n,
                         sunindextype mu, sunindextype ml, sunindextype smu)
{
  sunindextype i, j, colSize;
  sunrealtype* col_j;

  colSize = mu + ml + 1;

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    for (i = 0; i < colSize; i++) { col_j[i] *= c; }
  }
}